

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nghttp2_http.c
# Opt level: O1

int nghttp2_http_on_header
              (nghttp2_session *session,nghttp2_stream *stream,nghttp2_frame *frame,
              nghttp2_hd_nv *nv,int trailer)

{
  byte bVar1;
  byte *pbVar2;
  uint8_t *puVar3;
  nghttp2_rcbuf *pnVar4;
  int *piVar5;
  uint8_t uVar6;
  int iVar7;
  uint uVar8;
  uint8_t *bb;
  int64_t iVar9;
  long lVar10;
  size_t sVar11;
  int iVar12;
  byte bVar13;
  size_t sVar14;
  byte bVar15;
  long lVar16;
  short sVar17;
  ulong uVar18;
  bool bVar19;
  nghttp2_extpri nStack_38;
  
  iVar7 = nghttp2_check_header_name(nv->name->base,nv->name->len);
  if (iVar7 == 0) {
    pnVar4 = nv->name;
    if (pnVar4->len != 0) {
      if (*pnVar4->base == ':') {
        return -0x213;
      }
      sVar11 = 0;
      do {
        if (0xe5 < (byte)(pnVar4->base[sVar11] + 0xa5)) {
          return -0x213;
        }
        sVar11 = sVar11 + 1;
      } while (pnVar4->len != sVar11);
    }
    goto LAB_0055efc9;
  }
  iVar7 = nv->token;
  switch(iVar7) {
  case 0:
switchD_0055ed42_caseD_0:
    if ((session->server == '\0') && ((frame->hd).type != '\x05')) goto switchD_0055ed42_caseD_2;
    iVar7 = nghttp2_check_authority(nv->value->base,nv->value->len);
    break;
  case 1:
    iVar7 = nghttp2_check_method(nv->value->base,nv->value->len);
    break;
  case 2:
  case 4:
switchD_0055ed42_caseD_2:
    puVar3 = nv->value->base;
    sVar11 = nv->value->len;
    if ((stream->flags & 0x40) == 0) {
      iVar7 = nghttp2_check_header_value_rfc9113(puVar3,sVar11);
    }
    else {
      iVar7 = nghttp2_check_header_value(puVar3,sVar11);
    }
    break;
  case 3:
    iVar7 = nghttp2_check_path(nv->value->base,nv->value->len);
    break;
  case 5:
    sVar11 = nv->value->len;
    iVar7 = 0;
    if ((sVar11 != 0) && (pbVar2 = nv->value->base, (byte)((*pbVar2 & 0xdf) + 0xbf) < 0x1a)) {
      if (sVar11 != 1) {
        sVar14 = 1;
        do {
          bVar1 = pbVar2[sVar14];
          if (((9 < (byte)(bVar1 - 0x30)) && (0x19 < (byte)((bVar1 & 0xdf) + 0xbf))) &&
             ((0x2e < bVar1 || ((0x680000000000U >> ((ulong)bVar1 & 0x3f) & 1) == 0))))
          goto LAB_0055eec6;
          sVar14 = sVar14 + 1;
        } while (sVar11 != sVar14);
      }
      iVar7 = 1;
    }
    break;
  default:
    if (iVar7 == 0x25) goto switchD_0055ed42_caseD_0;
    if ((iVar7 != 0x42) || ((stream->flags & 0x40) == 0)) goto switchD_0055ed42_caseD_2;
    sVar11 = nv->value->len;
    if (sVar11 == 0) {
      iVar7 = 0;
    }
    else {
      sVar14 = 0;
      do {
        uVar6 = nv->value->base[sVar14];
        if ((uVar6 != ' ') && (uVar6 != '\t')) goto switchD_0055ed42_caseD_2;
        sVar14 = sVar14 + 1;
        iVar7 = 0;
      } while (sVar11 != sVar14);
    }
  }
LAB_0055eec6:
  if (iVar7 == 0) {
    if (nv->name->len == 0) {
      __assert_fail("nv->name->len > 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Utilities/cmnghttp2/lib/nghttp2_http.c"
                    ,0x1a7,
                    "int nghttp2_http_on_header(nghttp2_session *, nghttp2_stream *, nghttp2_frame *, nghttp2_hd_nv *, int)"
                   );
    }
    if (*nv->name->base == ':') {
      return -0x213;
    }
LAB_0055efc9:
    *(byte *)&stream->http_flags = (byte)stream->http_flags | 0x40;
    return -0x69;
  }
  if (session->server == '\0') {
    if ((frame->hd).type == '\x05') {
      bVar19 = true;
      goto LAB_0055eeea;
    }
    puVar3 = nv->name->base;
    uVar6 = *puVar3;
    if (uVar6 == ':') {
      if (trailer != 0) {
        return -0x213;
      }
      if ((stream->http_flags & 0x40) != 0) {
        return -0x213;
      }
    }
    iVar7 = nv->token;
    if (iVar7 < 0x3d) {
      if (iVar7 == 7) {
        if ((stream->http_flags & 0x20) != 0) {
          return -0x213;
        }
        pnVar4 = nv->value;
        sVar11 = pnVar4->len;
        if (sVar11 == 0) {
          return -0x213;
        }
        stream->http_flags = stream->http_flags | 0x20;
        if (sVar11 != 3) {
          return -0x213;
        }
        lVar10 = 0;
        lVar16 = 0;
        do {
          bVar1 = pnVar4->base[lVar10];
          sVar17 = -1;
          if (((byte)(bVar1 - 0x3a) < 0xf6) || (0xccccccccccccccc < lVar16)) break;
          uVar18 = (ulong)(bVar1 & 0xf);
          if ((long)(uVar18 ^ 0x7fffffffffffffff) < lVar16 * 10) break;
          lVar16 = lVar16 * 10 + uVar18;
          lVar10 = lVar10 + 1;
          sVar17 = (short)lVar16;
        } while (lVar10 != 3);
        stream->status_code = sVar17;
        if (sVar17 == 0x65) {
          return -0x213;
        }
        if (sVar17 == -1) {
          return -0x213;
        }
      }
      else {
        if (iVar7 != 0x1b) {
          if (iVar7 == 0x38) {
            return -0x213;
          }
          goto LAB_0055f4df;
        }
        sVar17 = stream->status_code;
        if (sVar17 == 0xcc) {
          if (stream->content_length != -1) {
            return -0x213;
          }
          if (nv->value->len != 1) {
            return -0x213;
          }
          bVar1 = *nv->value->base;
          bVar13 = bVar1 | 0x20;
          if (0x19 < (byte)(bVar1 + 0xbf)) {
            bVar13 = bVar1;
          }
          if (bVar13 != 0x30) {
            return -0x213;
          }
          stream->content_length = 0;
          return -0x6a;
        }
        if ((ushort)(sVar17 - 100U) < 100) {
          return -0x213;
        }
        if (((ushort)(sVar17 - 200U) < 100) && ((stream->http_flags & 0x80) != 0)) {
          return -0x6a;
        }
        if (stream->content_length != -1) {
          return -0x213;
        }
        iVar9 = parse_uint(nv->value->base,nv->value->len);
        stream->content_length = iVar9;
        if (iVar9 == -1) {
          return -0x213;
        }
      }
    }
    else {
      if (iVar7 - 0x3eU < 4) {
        return -0x213;
      }
      if (iVar7 == 0x3d) {
        if (nv->value->len != 8) {
          return -0x213;
        }
        lVar10 = 0;
        do {
          bVar1 = "trailers"[lVar10];
          bVar13 = bVar1 | 0x20;
          if (0x19 < (byte)(bVar1 + 0xbf)) {
            bVar13 = bVar1;
          }
          bVar1 = nv->value->base[lVar10];
          bVar15 = bVar1 | 0x20;
          if (0x19 < (byte)(bVar1 + 0xbf)) {
            bVar15 = bVar1;
          }
        } while ((bVar13 == bVar15) && (bVar19 = lVar10 != 7, lVar10 = lVar10 + 1, bVar19));
        if (bVar13 != bVar15) {
          return -0x213;
        }
      }
      else {
LAB_0055f4df:
        if (uVar6 == ':') {
          return -0x213;
        }
      }
    }
    if (*puVar3 == ':') {
      return 0;
    }
    goto LAB_0055f563;
  }
  bVar19 = session->pending_enable_connect_protocol == '\0';
LAB_0055eeea:
  uVar6 = *nv->name->base;
  if (uVar6 == ':') {
    if (trailer != 0) {
      return -0x213;
    }
    if ((stream->http_flags & 0x40) != 0) {
      return -0x213;
    }
  }
  iVar7 = nv->token;
  iVar12 = -0x213;
  if (0x37 < iVar7) {
    switch(iVar7) {
    case 0x38:
    case 0x3e:
    case 0x3f:
    case 0x40:
    case 0x41:
      goto switchD_0055ef3e_caseD_38;
    default:
      goto switchD_0055ef3e_caseD_39;
    case 0x3d:
      if (nv->value->len != 8) {
        return -0x213;
      }
      lVar10 = 0;
      do {
        bVar1 = "trailers"[lVar10];
        bVar13 = bVar1 | 0x20;
        if (0x19 < (byte)(bVar1 + 0xbf)) {
          bVar13 = bVar1;
        }
        bVar1 = nv->value->base[lVar10];
        bVar15 = bVar1 | 0x20;
        if (0x19 < (byte)(bVar1 + 0xbf)) {
          bVar15 = bVar1;
        }
      } while ((bVar13 == bVar15) && (bVar19 = lVar10 != 7, lVar10 = lVar10 + 1, bVar19));
      if (bVar13 != bVar15) {
        return -0x213;
      }
      break;
    case 0x42:
      if (bVar19) {
        return -0x213;
      }
      if ((short)stream->http_flags < 0) {
        return -0x213;
      }
      if (nv->value->len == 0) {
        return -0x213;
      }
      uVar8 = stream->http_flags | 0x8000;
      goto LAB_0055f54b;
    case 0x43:
      if ((((trailer == 0) && ((stream->stream_id & 1) != 0)) && ((stream->flags & 0x10) != 0)) &&
         ((stream->http_flags & 0x20000) == 0)) {
        nghttp2_extpri_from_uint8(&nStack_38,stream->http_extpri);
        iVar7 = nghttp2_http_parse_priority(&nStack_38,nv->value->base,nv->value->len);
        if (iVar7 != 0) {
          uVar8 = stream->http_flags & 0xfffcffff | 0x20000;
          goto LAB_0055f54b;
        }
        uVar6 = nghttp2_extpri_to_uint8(&nStack_38);
        stream->http_extpri = uVar6;
        pbVar2 = (byte *)((long)&stream->http_flags + 2);
        *pbVar2 = *pbVar2 | 1;
      }
    }
    goto LAB_0055f551;
  }
  switch(iVar7) {
  case 0:
    if ((stream->http_flags & 1) != 0) {
      return -0x213;
    }
    if (nv->value->len == 0) {
      return -0x213;
    }
    uVar8 = stream->http_flags | 1;
    goto LAB_0055f54b;
  case 1:
    uVar8 = stream->http_flags;
    if ((uVar8 & 4) != 0) {
      return -0x213;
    }
    pnVar4 = nv->value;
    sVar11 = pnVar4->len;
    if (sVar11 == 0) {
      return -0x213;
    }
    stream->http_flags = uVar8 | 4;
    if (sVar11 != 7) {
      if ((sVar11 != 4) || (*(int *)pnVar4->base != 0x44414548)) break;
      uVar8 = uVar8 | 0x104;
      goto LAB_0055f54b;
    }
    piVar5 = (int *)pnVar4->base;
    if (*(char *)((long)piVar5 + 6) == 'S') {
      if (*(int *)((long)piVar5 + 3) == 0x534e4f49 && *piVar5 == 0x4954504f) {
        uVar8 = uVar8 | 0x204;
        goto LAB_0055f54b;
      }
    }
    else if ((*(char *)((long)piVar5 + 6) == 'T') &&
            (*(int *)((long)piVar5 + 3) == 0x5443454e && *piVar5 == 0x4e4e4f43)) {
      if ((stream->stream_id & 1) == 0) {
        return -0x213;
      }
      uVar8 = uVar8 | 0x84;
      goto LAB_0055f54b;
    }
    break;
  case 2:
  case 4:
switchD_0055ef3e_caseD_39:
    if (uVar6 == ':') {
      return -0x213;
    }
    break;
  case 3:
    uVar8 = stream->http_flags;
    if ((uVar8 & 2) != 0) {
      return -0x213;
    }
    pnVar4 = nv->value;
    sVar11 = pnVar4->len;
    if (sVar11 == 0) {
      return -0x213;
    }
    stream->http_flags = uVar8 | 2;
    uVar6 = *pnVar4->base;
    if (uVar6 == '/') {
      uVar8 = uVar8 | 0x802;
    }
    else {
      if (uVar6 != '*' || sVar11 != 1) break;
      uVar8 = uVar8 | 0x1002;
    }
LAB_0055f54b:
    stream->http_flags = uVar8;
    break;
  case 5:
    uVar8 = stream->http_flags;
    if ((uVar8 & 8) != 0) {
      return -0x213;
    }
    pnVar4 = nv->value;
    sVar11 = pnVar4->len;
    if (sVar11 == 0) {
      return -0x213;
    }
    stream->http_flags = uVar8 | 8;
    if (sVar11 == 5) {
      lVar10 = 0;
      do {
        bVar1 = "https"[lVar10];
        bVar13 = bVar1 | 0x20;
        if (0x19 < (byte)(bVar1 + 0xbf)) {
          bVar13 = bVar1;
        }
        bVar1 = pnVar4->base[lVar10];
        bVar15 = bVar1 | 0x20;
        if (0x19 < (byte)(bVar1 + 0xbf)) {
          bVar15 = bVar1;
        }
      } while ((bVar13 == bVar15) && (bVar19 = lVar10 != 4, lVar10 = lVar10 + 1, bVar19));
      if (bVar13 == bVar15) {
LAB_0055f249:
        uVar8 = uVar8 | 0x2008;
        goto LAB_0055f54b;
      }
    }
    else if (sVar11 == 4) {
      lVar10 = 0;
      do {
        bVar1 = "http"[lVar10];
        bVar13 = bVar1 | 0x20;
        if (0x19 < (byte)(bVar1 + 0xbf)) {
          bVar13 = bVar1;
        }
        bVar1 = pnVar4->base[lVar10];
        bVar15 = bVar1 | 0x20;
        if (0x19 < (byte)(bVar1 + 0xbf)) {
          bVar15 = bVar1;
        }
      } while ((bVar13 == bVar15) && (bVar19 = lVar10 != 3, lVar10 = lVar10 + 1, bVar19));
      if (bVar13 == bVar15) goto LAB_0055f249;
    }
    break;
  default:
    if (iVar7 != 0x1b) {
      if (iVar7 != 0x25) goto switchD_0055ef3e_caseD_39;
      if ((stream->http_flags & 0x10) != 0) {
        return -0x213;
      }
      if (nv->value->len == 0) {
        return -0x213;
      }
      uVar8 = stream->http_flags | 0x10;
      goto LAB_0055f54b;
    }
    if (stream->content_length != -1) {
      return -0x213;
    }
    iVar9 = parse_uint(nv->value->base,nv->value->len);
    stream->content_length = iVar9;
    if (iVar9 == -1) {
      return -0x213;
    }
  }
LAB_0055f551:
  iVar12 = 0;
  if (*nv->name->base != ':') {
LAB_0055f563:
    iVar12 = 0;
    *(byte *)&stream->http_flags = (byte)stream->http_flags | 0x40;
  }
switchD_0055ef3e_caseD_38:
  return iVar12;
}

Assistant:

int nghttp2_http_on_header(nghttp2_session *session, nghttp2_stream *stream,
                           nghttp2_frame *frame, nghttp2_hd_nv *nv,
                           int trailer) {
  int rv;

  /* We are strict for pseudo header field.  One bad character should
     lead to fail.  OTOH, we should be a bit forgiving for regular
     headers, since existing public internet has so much illegal
     headers floating around and if we kill the stream because of
     this, we may disrupt many web sites and/or libraries.  So we
     become conservative here, and just ignore those illegal regular
     headers. */
  if (!nghttp2_check_header_name(nv->name->base, nv->name->len)) {
    size_t i;
    if (nv->name->len > 0 && nv->name->base[0] == ':') {
      return NGHTTP2_ERR_HTTP_HEADER;
    }
    /* header field name must be lower-cased without exception */
    for (i = 0; i < nv->name->len; ++i) {
      uint8_t c = nv->name->base[i];
      if ('A' <= c && c <= 'Z') {
        return NGHTTP2_ERR_HTTP_HEADER;
      }
    }
    /* When ignoring regular headers, we set this flag so that we
       still enforce header field ordering rule for pseudo header
       fields. */
    stream->http_flags |= NGHTTP2_HTTP_FLAG_PSEUDO_HEADER_DISALLOWED;
    return NGHTTP2_ERR_IGN_HTTP_HEADER;
  }

  switch (nv->token) {
  case NGHTTP2_TOKEN__METHOD:
    rv = nghttp2_check_method(nv->value->base, nv->value->len);
    break;
  case NGHTTP2_TOKEN__PATH:
    rv = nghttp2_check_path(nv->value->base, nv->value->len);
    break;
  case NGHTTP2_TOKEN__AUTHORITY:
  case NGHTTP2_TOKEN_HOST:
    if (session->server || frame->hd.type == NGHTTP2_PUSH_PROMISE) {
      rv = nghttp2_check_authority(nv->value->base, nv->value->len);
    } else if (
        stream->flags &
        NGHTTP2_STREAM_FLAG_NO_RFC9113_LEADING_AND_TRAILING_WS_VALIDATION) {
      rv = nghttp2_check_header_value(nv->value->base, nv->value->len);
    } else {
      rv = nghttp2_check_header_value_rfc9113(nv->value->base, nv->value->len);
    }
    break;
  case NGHTTP2_TOKEN__SCHEME:
    rv = check_scheme(nv->value->base, nv->value->len);
    break;
  case NGHTTP2_TOKEN__PROTOCOL:
    /* Check the value consists of just white spaces, which was done
       in check_pseudo_header before
       nghttp2_check_header_value_rfc9113 has been introduced. */
    if ((stream->flags &
         NGHTTP2_STREAM_FLAG_NO_RFC9113_LEADING_AND_TRAILING_WS_VALIDATION) &&
        lws(nv->value->base, nv->value->len)) {
      rv = 0;
      break;
    }
    /* fall through */
  default:
    if (stream->flags &
        NGHTTP2_STREAM_FLAG_NO_RFC9113_LEADING_AND_TRAILING_WS_VALIDATION) {
      rv = nghttp2_check_header_value(nv->value->base, nv->value->len);
    } else {
      rv = nghttp2_check_header_value_rfc9113(nv->value->base, nv->value->len);
    }
  }

  if (rv == 0) {
    assert(nv->name->len > 0);
    if (nv->name->base[0] == ':') {
      return NGHTTP2_ERR_HTTP_HEADER;
    }
    /* When ignoring regular headers, we set this flag so that we
       still enforce header field ordering rule for pseudo header
       fields. */
    stream->http_flags |= NGHTTP2_HTTP_FLAG_PSEUDO_HEADER_DISALLOWED;
    return NGHTTP2_ERR_IGN_HTTP_HEADER;
  }

  if (session->server || frame->hd.type == NGHTTP2_PUSH_PROMISE) {
    return http_request_on_header(stream, nv, trailer,
                                  session->server &&
                                      session->pending_enable_connect_protocol);
  }

  return http_response_on_header(stream, nv, trailer);
}